

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcArbitraryOpenProfileDef::IfcArbitraryOpenProfileDef
          (IfcArbitraryOpenProfileDef *this,void **vtt)

{
  void *pvVar1;
  _func_int **pp_Var2;
  
  IfcProfileDef::IfcProfileDef(&this->super_IfcProfileDef,vtt + 1);
  pvVar1 = vtt[5];
  *(void **)&(this->super_IfcProfileDef).field_0x58 = pvVar1;
  *(void **)(&(this->super_IfcProfileDef).field_0x58 + *(long *)((long)pvVar1 + -0x18)) = vtt[6];
  *(undefined8 *)&(this->super_IfcProfileDef).field_0x60 = 0;
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = pp_Var2;
  *(void **)((long)&(this->super_IfcProfileDef).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var2[-3]) = vtt[7];
  *(void **)&(this->super_IfcProfileDef).field_0x58 = vtt[8];
  *(undefined8 *)&(this->super_IfcProfileDef).field_0x68 = 0;
  return;
}

Assistant:

IfcArbitraryOpenProfileDef() : Object("IfcArbitraryOpenProfileDef") {}